

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>::lerp
          (LightNodeImpl<embree::SceneGraph::AmbientLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  bool bVar1;
  long *plVar2;
  LightNodeImpl<embree::SceneGraph::AmbientLight> *this_00;
  long *in_RDX;
  long *plVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  float fVar4;
  AmbientLight local_48;
  
  bVar1 = true;
  if (*in_RDX == 0) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(*in_RDX,&LightNode::typeinfo,&typeinfo,0,in_R8,in_R9,f);
    plVar3 = (long *)0x0;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x10))(plVar2);
      bVar1 = false;
      plVar3 = plVar2;
    }
  }
  this_00 = (LightNodeImpl<embree::SceneGraph::AmbientLight> *)operator_new(0x90);
  fVar4 = 1.0 - f;
  local_48.L.field_0.m128[0] =
       fVar4 * *(float *)&light1_in[0x10].ptr + f * *(float *)(plVar3 + 0x10);
  local_48.L.field_0.m128[1] =
       fVar4 * *(float *)((long)&light1_in[0x10].ptr + 4) + f * *(float *)((long)plVar3 + 0x84);
  local_48.L.field_0.m128[2] =
       fVar4 * *(float *)&light1_in[0x11].ptr + f * *(float *)(plVar3 + 0x11);
  local_48.L.field_0.m128[3] =
       fVar4 * *(float *)((long)&light1_in[0x11].ptr + 4) + f * *(float *)((long)plVar3 + 0x8c);
  local_48.super_Light.type = LIGHT_AMBIENT;
  LightNodeImpl(this_00,&local_48);
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
  if (!bVar1) {
    (**(code **)(*plVar3 + 0x18))(plVar3);
  }
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }